

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * sh4asm_tok_as_str(sh4asm_tok *tk)

{
  sh4asm_tok_mapping *local_20;
  sh4asm_tok_mapping *curs;
  sh4asm_tok *tk_local;
  
  if (tk->tp == SH4ASM_TOK_IMM) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"#0x%x",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else if (tk->tp == SH4ASM_TOK_RN) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"r%u",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else if (tk->tp == SH4ASM_TOK_RN_BANK) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"r%u_bank",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else if (tk->tp == SH4ASM_TOK_FRN) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"fr%u",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else if (tk->tp == SH4ASM_TOK_DRN) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"dr%u",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else if (tk->tp == SH4ASM_TOK_XDN) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"xd%u",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else if (tk->tp == SH4ASM_TOK_FVN) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"fv%u",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else if (tk->tp == SH4ASM_TOK_DISP) {
    snprintf(sh4asm_tok_as_str::buf,0x20,"0x%x",(ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
    tk_local = (sh4asm_tok *)sh4asm_tok_as_str::buf;
  }
  else {
    for (local_20 = tok_map; local_20->txt != (char *)0x0; local_20 = local_20 + 1) {
      if (local_20->tok == tk->tp) {
        return local_20->txt;
      }
    }
    tk_local = (sh4asm_tok *)0x0;
  }
  return (char *)tk_local;
}

Assistant:

char const *sh4asm_tok_as_str(struct sh4asm_tok const *tk) {
    static char buf[SH4ASM_TOK_LEN_MAX];

    if (tk->tp == SH4ASM_TOK_IMM) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "#0x%x", tk->val.as_int);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_RN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "r%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_RN_BANK) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "r%u_bank", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_FRN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "fr%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_DRN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "dr%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_XDN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "xd%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_FVN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "fv%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_DISP) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "0x%x", tk->val.as_int);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    }

    struct sh4asm_tok_mapping const *curs = tok_map;
    while (curs->txt) {
        if (curs->tok == tk->tp)
            return curs->txt;
        curs++;
    }

    return NULL;
}